

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::anon_unknown_0::MergeMulMulArithmetic::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,IRContext *context,Instruction *inst,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *constants)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  Op OVar1;
  uint32_t uVar2;
  Op OVar3;
  ConstantManager *this_00;
  TypeManager *this_01;
  Type *type_00;
  Constant *input1;
  const_reference ppCVar4;
  reference ppCVar5;
  bool bVar6;
  Operand *local_1c0;
  uint32_t local_1b4;
  allocator<spvtools::opt::Operand> local_18d;
  uint32_t local_18c;
  iterator local_188;
  undefined8 local_180;
  SmallVector<unsigned_int,_2UL> local_178;
  uint32_t local_14c;
  iterator local_148;
  undefined8 local_140;
  SmallVector<unsigned_int,_2UL> local_138;
  Operand local_110;
  Operand OStack_e0;
  iterator local_b0;
  _func_int **local_a8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_a0;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t non_const_id;
  uint32_t merged_id;
  bool other_first_is_variable;
  Constant *pCStack_78;
  Constant *const_input2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  other_constants;
  Instruction *other_inst;
  Constant *const_input1;
  uint32_t width;
  Type *type;
  ConstantManager *const_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *constants_local;
  Instruction *inst_local;
  IRContext *context_local;
  anon_class_1_0_00000001 *this_local;
  
  OVar1 = Instruction::opcode(inst);
  bVar6 = true;
  if (OVar1 != OpFMul) {
    OVar1 = Instruction::opcode(inst);
    bVar6 = OVar1 == OpIMul;
  }
  if (bVar6) {
    this_00 = IRContext::get_constant_mgr(context);
    this_01 = IRContext::get_type_mgr(context);
    uVar2 = Instruction::type_id(inst);
    type_00 = analysis::TypeManager::GetType(this_01,uVar2);
    bVar6 = IsCooperativeMatrix(type_00);
    if (bVar6) {
      this_local._7_1_ = false;
    }
    else {
      bVar6 = HasFloatingPoint(type_00);
      if ((!bVar6) || (bVar6 = Instruction::IsFloatingPointFoldingAllowed(inst), bVar6)) {
        uVar2 = ElementWidth(type_00);
        if ((uVar2 == 0x20) || (uVar2 == 0x40)) {
          input1 = ConstInput(constants);
          if (input1 == (Constant *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            ppCVar4 = std::
                      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ::operator[](constants,0);
            other_constants.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)NonConstInput(context,*ppCVar4,inst);
            bVar6 = HasFloatingPoint(type_00);
            if ((!bVar6) ||
               (bVar6 = Instruction::IsFloatingPointFoldingAllowed
                                  ((Instruction *)
                                   other_constants.
                                   super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar6)) {
              OVar1 = Instruction::opcode((Instruction *)
                                          other_constants.
                                          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              OVar3 = Instruction::opcode(inst);
              if (OVar1 == OVar3) {
                analysis::ConstantManager::GetOperandConstants
                          ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)&const_input2,this_00,
                           (Instruction *)
                           other_constants.
                           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pCStack_78 = ConstInput((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                         *)&const_input2);
                if (pCStack_78 == (Constant *)0x0) {
                  this_local._7_1_ = false;
                }
                else {
                  ppCVar5 = std::
                            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            ::operator[]((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                          *)&const_input2,0);
                  non_const_id._3_1_ = *ppCVar5 == (value_type)0x0;
                  OVar1 = Instruction::opcode(inst);
                  local_84 = PerformOperation(this_00,OVar1,input1,pCStack_78);
                  if (local_84 == 0) {
                    this_local._7_1_ = false;
                  }
                  else {
                    if ((non_const_id._3_1_ & 1) == 0) {
                      local_1b4 = Instruction::GetSingleWordInOperand
                                            ((Instruction *)
                                             other_constants.
                                             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
                    }
                    else {
                      local_1b4 = Instruction::GetSingleWordInOperand
                                            ((Instruction *)
                                             other_constants.
                                             super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
                    }
                    local_88 = local_1b4;
                    local_14c = local_1b4;
                    local_148 = &local_14c;
                    local_140 = 1;
                    init_list_00._M_len = 1;
                    init_list_00._M_array = local_148;
                    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_138,init_list_00);
                    Operand::Operand(&local_110,SPV_OPERAND_TYPE_ID,&local_138);
                    local_18c = local_84;
                    local_188 = &local_18c;
                    local_180 = 1;
                    init_list._M_len = 1;
                    init_list._M_array = local_188;
                    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_178,init_list);
                    Operand::Operand(&OStack_e0,SPV_OPERAND_TYPE_ID,&local_178);
                    local_b0 = &local_110;
                    local_a8 = (_func_int **)0x2;
                    std::allocator<spvtools::opt::Operand>::allocator(&local_18d);
                    __l._M_len = (size_type)local_a8;
                    __l._M_array = local_b0;
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    vector(&local_a0,__l,&local_18d);
                    Instruction::SetInOperands(inst,&local_a0);
                    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
                    ~vector(&local_a0);
                    std::allocator<spvtools::opt::Operand>::~allocator(&local_18d);
                    local_1c0 = (Operand *)&local_b0;
                    do {
                      local_1c0 = local_1c0 + -1;
                      Operand::~Operand(local_1c0);
                    } while (local_1c0 != &local_110);
                    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_178);
                    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_138);
                    this_local._7_1_ = true;
                  }
                }
                merged_id = 1;
                std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           *)&const_input2);
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    return this_local._7_1_;
  }
  __assert_fail("inst->opcode() == spv::Op::OpFMul || inst->opcode() == spv::Op::OpIMul",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0x2c2,
                "auto spvtools::opt::(anonymous namespace)::MergeMulMulArithmetic()::(anonymous class)::operator()(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &) const"
               );
}

Assistant:

FoldingRule MergeMulMulArithmetic() {
  return [](IRContext* context, Instruction* inst,
            const std::vector<const analysis::Constant*>& constants) {
    assert(inst->opcode() == spv::Op::OpFMul ||
           inst->opcode() == spv::Op::OpIMul);
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    const analysis::Type* type =
        context->get_type_mgr()->GetType(inst->type_id());

    if (IsCooperativeMatrix(type)) {
      return false;
    }

    if (HasFloatingPoint(type) && !inst->IsFloatingPointFoldingAllowed())
      return false;

    uint32_t width = ElementWidth(type);
    if (width != 32 && width != 64) return false;

    // Determine the constant input and the variable input in |inst|.
    const analysis::Constant* const_input1 = ConstInput(constants);
    if (!const_input1) return false;
    Instruction* other_inst = NonConstInput(context, constants[0], inst);
    if (HasFloatingPoint(type) && !other_inst->IsFloatingPointFoldingAllowed())
      return false;

    if (other_inst->opcode() == inst->opcode()) {
      std::vector<const analysis::Constant*> other_constants =
          const_mgr->GetOperandConstants(other_inst);
      const analysis::Constant* const_input2 = ConstInput(other_constants);
      if (!const_input2) return false;

      bool other_first_is_variable = other_constants[0] == nullptr;
      uint32_t merged_id = PerformOperation(const_mgr, inst->opcode(),
                                            const_input1, const_input2);
      if (merged_id == 0) return false;

      uint32_t non_const_id = other_first_is_variable
                                  ? other_inst->GetSingleWordInOperand(0u)
                                  : other_inst->GetSingleWordInOperand(1u);
      inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {non_const_id}},
                           {SPV_OPERAND_TYPE_ID, {merged_id}}});
      return true;
    }

    return false;
  };
}